

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O3

int32_t zng_gzputs(gzFile file,char *s)

{
  size_t len;
  size_t sVar1;
  int32_t iVar2;
  
  iVar2 = -1;
  if (((file != (gzFile)0x0) && (file[1].have == 0x79b1)) && (*(int *)((long)&file[4].pos + 4) == 0)
     ) {
    len = strlen(s);
    if ((len & 0xffffffff80000000) == 0) {
      sVar1 = gz_write((gz_state *)file,s,len);
      iVar2 = -1;
      if (len <= sVar1) {
        iVar2 = (int32_t)len;
      }
    }
    else {
      gz_error((gz_state *)file,-2,"string length does not fit in int");
    }
  }
  return iVar2;
}

Assistant:

int Z_EXPORT PREFIX(gzputs)(gzFile file, const char *s) {
    size_t len, put;
    gz_state *state;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_state *)file;

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return -1;

    /* write string */
    len = strlen(s);
    if ((int)len < 0 || (unsigned)len != len) {
        gz_error(state, Z_STREAM_ERROR, "string length does not fit in int");
        return -1;
    }
    put = gz_write(state, s, len);
    return put < len ? -1 : (int)len;
}